

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O0

bool __thiscall kj::AtomicRefcounted::addRefWeakInternal(AtomicRefcounted *this)

{
  uint uVar1;
  bool bVar2;
  uint local_1c;
  uint orig;
  AtomicRefcounted *this_local;
  
  local_1c = this->refcount;
  do {
    if (local_1c == 0) {
      return false;
    }
    LOCK();
    uVar1 = this->refcount;
    bVar2 = local_1c == uVar1;
    if (bVar2) {
      this->refcount = local_1c + 1;
      uVar1 = local_1c;
    }
    UNLOCK();
    local_1c = uVar1;
  } while (!bVar2);
  return true;
}

Assistant:

bool AtomicRefcounted::addRefWeakInternal() const {
#if _MSC_VER && !defined(__clang__)
  long orig = refcount;

  for (;;) {
    if (orig == 0) {
      // Refcount already hit zero. Destructor is already running so we can't revive the object.
      return false;
    }

    unsigned long old = KJ_MSVC_INTERLOCKED(CompareExchange, nf)(&refcount, orig + 1, orig);
    if (old == orig) {
      return true;
    }
    orig = old;
  }
#else
  uint orig = __atomic_load_n(&refcount, __ATOMIC_RELAXED);

  for (;;) {
    if (orig == 0) {
      // Refcount already hit zero. Destructor is already running so we can't revive the object.
      return false;
    }

    if (__atomic_compare_exchange_n(&refcount, &orig, orig + 1, true,
        __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
      // Successfully incremented refcount without letting it hit zero.
      return true;
    }
  }
#endif
}